

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O2

void __thiscall minibag::View::iterator::increment(iterator *this)

{
  _Base_ptr p_Var1;
  View *pVVar2;
  pointer pVVar3;
  
  if (this->message_instance_ != (MessageInstance *)0x0) {
    operator_delete(this->message_instance_,0x28);
    this->message_instance_ = (MessageInstance *)0x0;
  }
  update(this->view_);
  pVVar2 = this->view_;
  if (this->view_revision_ != pVVar2->view_revision_) {
    populateSeek(this,(this->iters_).
                      super__Vector_base<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1].iter._M_node);
    pVVar2 = this->view_;
  }
  pVVar3 = (this->iters_).
           super__Vector_base<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pVVar2->reduce_overlap_ == true) {
    p_Var1 = pVVar3[-1].iter._M_node;
    while (((this->iters_).
            super__Vector_base<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_>.
            _M_impl.super__Vector_impl_data._M_start != pVVar3 &&
           (pVVar3[-1].iter._M_node == p_Var1))) {
      std::_Rb_tree_const_iterator<minibag::IndexEntry>::operator++(&pVVar3[-1].iter,0);
      pVVar3 = (this->iters_).
               super__Vector_base<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pVVar3[-1].iter._M_node == ((pVVar3[-1].range)->end)._M_node) {
        (this->iters_).
        super__Vector_base<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_>.
        _M_impl.super__Vector_impl_data._M_finish = pVVar3 + -1;
      }
      std::
      __sort<__gnu_cxx::__normal_iterator<minibag::ViewIterHelper*,std::vector<minibag::ViewIterHelper,std::allocator<minibag::ViewIterHelper>>>,__gnu_cxx::__ops::_Iter_comp_iter<minibag::ViewIterHelperCompare>>
                ((this->iters_).
                 super__Vector_base<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      pVVar3 = (this->iters_).
               super__Vector_base<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    return;
  }
  std::_Rb_tree_const_iterator<minibag::IndexEntry>::operator++(&pVVar3[-1].iter,0);
  pVVar3 = (this->iters_).
           super__Vector_base<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pVVar3[-1].iter._M_node == ((pVVar3[-1].range)->end)._M_node) {
    (this->iters_).
    super__Vector_base<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar3 + -1;
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<minibag::ViewIterHelper*,std::vector<minibag::ViewIterHelper,std::allocator<minibag::ViewIterHelper>>>,__gnu_cxx::__ops::_Iter_comp_iter<minibag::ViewIterHelperCompare>>
            ((this->iters_).
             super__Vector_base<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_>.
             _M_impl.super__Vector_impl_data._M_start);
  return;
}

Assistant:

void View::iterator::increment() {
    assert(view_ != NULL);

    // Our message instance is no longer valid
    if (message_instance_ != NULL)
    {
      delete message_instance_;
      message_instance_ = NULL;
    }

    view_->update();

    // Note, updating may have blown away our message-ranges and
    // replaced them in general the ViewIterHelpers are no longer
    // valid, but the iterator it stores should still be good.
    if (view_revision_ != view_->view_revision_)
        populateSeek(iters_.back().iter);

    if (view_->reduce_overlap_)
    {
        std::multiset<IndexEntry>::const_iterator last_iter = iters_.back().iter;
    
        while (!iters_.empty() && iters_.back().iter == last_iter)
        {
            iters_.back().iter++;
            if (iters_.back().iter == iters_.back().range->end)
                iters_.pop_back();
      
            std::sort(iters_.begin(), iters_.end(), ViewIterHelperCompare());
        }

    } else {

        iters_.back().iter++;
        if (iters_.back().iter == iters_.back().range->end)
            iters_.pop_back();
      
        std::sort(iters_.begin(), iters_.end(), ViewIterHelperCompare());
    }
}